

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

void gost_crypt_mesh(void *ctx,uchar *iv,uchar *buf)

{
  if ((*(int *)((long)ctx + 8) != 0) && (*(int *)((long)ctx + 4) == 0x400)) {
    cryptopro_key_meshing((gost_ctx *)((long)ctx + 0x1c),iv);
  }
  gostcrypt((gost_ctx *)((long)ctx + 0x1c),iv,buf);
  *(uint *)((long)ctx + 4) = (*(uint *)((long)ctx + 4) & 0x3ff) + 8;
  return;
}

Assistant:

static void gost_crypt_mesh(void *ctx, unsigned char *iv, unsigned char *buf)
{
    struct ossl_gost_cipher_ctx *c = ctx;
    assert(c->count % 8 == 0 && c->count <= 1024);
    if (c->key_meshing && c->count == 1024) {
        cryptopro_key_meshing(&(c->cctx), iv);
    }
    gostcrypt(&(c->cctx), iv, buf);
    c->count = c->count % 1024 + 8;
}